

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  bool bVar1;
  int iVar2;
  char *key;
  char *pcVar3;
  bool bVar4;
  string length;
  string local_f8;
  detail *local_d8;
  detail *local_d0;
  Request *local_c8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_long)>
  *local_c0;
  Server *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = res->status;
  if (iVar2 == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                  ,0x671,
                  "void httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < iVar2) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->error_handler_,req,res);
    iVar2 = res->status;
  }
  local_f8._M_dataplus._M_p = detail::status_message(iVar2);
  Stream::write_format<int,char_const*>(strm,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_f8);
  if (last_connection) {
    pcVar3 = "close";
  }
  else {
    Request::get_header_value_abi_cxx11_(&local_f8,req,"Connection",0);
    bVar1 = std::operator==(&local_f8,"close");
    std::__cxx11::string::~string((string *)&local_f8);
    if (bVar1) {
      Response::set_header(res,"Connection","close");
    }
    Request::get_header_value_abi_cxx11_(&local_f8,req,"Connection",0);
    pcVar3 = "Keep-Alive";
    bVar1 = std::operator==(&local_f8,"Keep-Alive");
    std::__cxx11::string::~string((string *)&local_f8);
    if (!bVar1) goto LAB_0015a430;
  }
  Response::set_header(res,"Connection",pcVar3);
LAB_0015a430:
  local_b8 = this;
  if ((res->body)._M_string_length == 0) {
    bVar1 = Response::has_header(res,"Content-Length");
    if (!bVar1) {
      if ((res->streamcb).super__Function_base._M_manager == (_Manager_type)0x0) {
        key = "Content-Length";
        pcVar3 = "0";
      }
      else {
        key = "Transfer-Encoding";
        pcVar3 = "chunked";
      }
      Response::set_header(res,key,pcVar3);
    }
  }
  else {
    bVar1 = Response::has_header(res,"Content-Type");
    if (!bVar1) {
      Response::set_header(res,"Content-Type","text/plain");
    }
    std::__cxx11::to_string(&local_f8,(res->body)._M_string_length);
    Response::set_header(res,"Content-Length",local_f8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  detail::write_headers<httplib::Response>(strm,res);
  local_c8 = req;
  bVar1 = std::operator!=(&req->method,"HEAD");
  if (bVar1) {
    if ((res->body)._M_string_length == 0) {
      if ((res->streamcb).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_c0 = &res->streamcb;
        bVar1 = Response::has_header(res,"Content-Length");
        bVar4 = true;
        local_d8 = (detail *)0x0;
        do {
          if (!bVar4) break;
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_long)>
          ::operator()(&local_f8,local_c0,(unsigned_long)local_d8);
          bVar4 = (detail *)local_f8._M_string_length != (detail *)0x0;
          local_d0 = (detail *)local_f8._M_string_length;
          if (!bVar1) {
            detail::from_i_to_hex_abi_cxx11_
                      (&local_b0,(detail *)local_f8._M_string_length,local_f8._M_string_length);
            std::operator+(&local_90,&local_b0,"\r\n");
            std::operator+(&local_70,&local_90,&local_f8);
            std::operator+(&local_50,&local_70,"\r\n");
            std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          iVar2 = (*strm->_vptr_Stream[3])(strm,local_f8._M_dataplus._M_p,local_f8._M_string_length)
          ;
          local_d8 = local_d8 + (long)local_d0;
          std::__cxx11::string::~string((string *)&local_f8);
        } while (-1 < iVar2);
      }
    }
    else {
      (*strm->_vptr_Stream[3])(strm,(res->body)._M_dataplus._M_p);
    }
  }
  if ((local_b8->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
              (&local_b8->logger_,local_c8,res);
  }
  return;
}

Assistant:

inline void Server::write_response(Stream& strm, bool last_connection, const Request& req, Response& res)
{
    assert(res.status != -1);

    if (400 <= res.status && error_handler_) {
        error_handler_(req, res);
    }

    // Response line
    strm.write_format("HTTP/1.1 %d %s\r\n",
        res.status,
        detail::status_message(res.status));

    // Headers
    if (last_connection ||
        req.get_header_value("Connection") == "close") {
        res.set_header("Connection", "close");
    }

    if (!last_connection &&
        req.get_header_value("Connection") == "Keep-Alive") {
        res.set_header("Connection", "Keep-Alive");
    }

    if (res.body.empty()) {
        if (!res.has_header("Content-Length")) {
            if (res.streamcb) {
                // Streamed response
                res.set_header("Transfer-Encoding", "chunked");
            } else {
                res.set_header("Content-Length", "0");
            }
        }
    } else {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        // TODO: 'Accpet-Encoding' has gzip, not gzip;q=0
        const auto& encodings = req.get_header_value("Accept-Encoding");
        if (encodings.find("gzip") != std::string::npos &&
            detail::can_compress(res.get_header_value("Content-Type"))) {
            detail::compress(res.body);
            res.set_header("Content-Encoding", "gzip");
        }
#endif

        if (!res.has_header("Content-Type")) {
            res.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(res.body.size());
        res.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, res);

    // Body
    if (req.method != "HEAD") {
        if (!res.body.empty()) {
            strm.write(res.body.c_str(), res.body.size());
        } else if (res.streamcb) {
            bool chunked_response = !res.has_header("Content-Length");
            uint64_t offset = 0;
            bool data_available = true;
            while (data_available) {
                std::string chunk = res.streamcb(offset);
                offset += chunk.size();
                data_available = !chunk.empty();
                // Emit chunked response header and footer for each chunk
                if (chunked_response)
                    chunk = detail::from_i_to_hex(chunk.size()) + "\r\n" + chunk + "\r\n";
                if (strm.write(chunk.c_str(), chunk.size()) < 0)
                    break;  // Stop on error
            }
        }
    }

    // Log
    if (logger_) {
        logger_(req, res);
    }
}